

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_strings.c
# Opt level: O1

void test_sbstring(CuTest *tc)

{
  size_t sVar1;
  char buffer [16];
  sbstring sbs;
  char acStack_58 [2];
  char local_56 [14];
  sbstring local_48;
  
  sbs_init(&local_48,acStack_58,0x10);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0xe7,(char *)0x0,"",local_48.begin);
  sVar1 = sbs_length(&local_48);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0xe8,(char *)0x0,0,(int)sVar1);
  sbs_strcat(&local_48,"Hodor");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0xea,(char *)0x0,"Hodor",local_48.begin);
  sbs_strcat(&local_48,"Hodor");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0xec,(char *)0x0,"HodorHodor",local_48.begin);
  sbs_init(&local_48,acStack_58,0x10);
  sbs_strcat(&local_48,"Hodor");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0xf0,(char *)0x0,"Hodor",local_48.begin);
  sbs_init(&local_48,acStack_58,0x10);
  sbs_strcat(&local_48,"12345678901234567890");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0xf4,(char *)0x0,"123456789012345",local_48.begin);
  CuAssertPtrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0xf5,(char *)0x0,local_48.begin + (local_48.size - 1),local_48.end);
  sbs_init(&local_48,acStack_58,0x10);
  sbs_strcat(&local_48,"12345678901234567890");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0xf9,(char *)0x0,"123456789012345",local_48.begin);
  CuAssertPtrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0xfa,(char *)0x0,acStack_58,local_48.begin);
  sbs_init(&local_48,acStack_58,0x10);
  sbs_strcat(&local_48,"1234567890");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0xfe,(char *)0x0,"1234567890",local_48.begin);
  sbs_strncat(&local_48,"1234567890",4);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x100,(char *)0x0,"12345678901234",local_48.begin);
  sbs_strncat(&local_48,"567890",6);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x102,(char *)0x0,"123456789012345",local_48.begin);
  sbs_adopt(&local_48,local_56,0xe);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x105,(char *)0x0,"3456789012345",local_48.begin);
  sVar1 = sbs_length(&local_48);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x106,(char *)0x0,0xd,(int)sVar1);
  sbs_adopt(&local_48,(char *)0x0,8);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x109,(char *)0x0,(char *)0x0,local_48.begin);
  sVar1 = sbs_length(&local_48);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x10a,(char *)0x0,0,(int)sVar1);
  return;
}

Assistant:

static void test_sbstring(CuTest * tc)
{
    char buffer[16];
    sbstring sbs;
    sbs_init(&sbs, buffer, sizeof(buffer));
    CuAssertStrEquals(tc, "", sbs.begin);
    CuAssertIntEquals(tc, 0, (int)sbs_length(&sbs));
    sbs_strcat(&sbs, "Hodor");
    CuAssertStrEquals(tc, "Hodor", sbs.begin);
    sbs_strcat(&sbs, "Hodor");
    CuAssertStrEquals(tc, "HodorHodor", sbs.begin);

    sbs_init(&sbs, buffer, sizeof(buffer));
    sbs_strcat(&sbs, "Hodor");
    CuAssertStrEquals(tc, "Hodor", sbs.begin);

    sbs_init(&sbs, buffer, sizeof(buffer));
    sbs_strcat(&sbs, "12345678901234567890");
    CuAssertStrEquals(tc, "123456789012345", sbs.begin);
    CuAssertPtrEquals(tc, sbs.begin + sbs.size - 1, sbs.end);

    sbs_init(&sbs, buffer, sizeof(buffer));
    sbs_strcat(&sbs, "12345678901234567890");
    CuAssertStrEquals(tc, "123456789012345", sbs.begin);
    CuAssertPtrEquals(tc, buffer, sbs.begin);

    sbs_init(&sbs, buffer, sizeof(buffer));
    sbs_strcat(&sbs, "1234567890");
    CuAssertStrEquals(tc, "1234567890", sbs.begin);
    sbs_strncat(&sbs, "1234567890", 4);
    CuAssertStrEquals(tc, "12345678901234", sbs.begin);
    sbs_strncat(&sbs, "567890", 6);
    CuAssertStrEquals(tc, "123456789012345", sbs.begin);

    sbs_adopt(&sbs, buffer + 2, sizeof(buffer) - 2);
    CuAssertStrEquals(tc, "3456789012345", sbs.begin);
    CuAssertIntEquals(tc, 13, (int)sbs_length(&sbs));

    sbs_adopt(&sbs, NULL, 8);
    CuAssertStrEquals(tc, NULL, sbs.begin);
    CuAssertIntEquals(tc, 0, (int)sbs_length(&sbs));
}